

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::inheritStyle(QWidgetPrivate *this)

{
  long lVar1;
  bool bVar2;
  QStyleSheetStyle *pQVar3;
  QWidget *pQVar4;
  QWidgetPrivate *newStyle_00;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetStyle *newProxy;
  QStyleSheetStyle *styleSheetStyle;
  QStyle *newStyle;
  QStyle *parentStyle;
  QWidget *parent;
  QStyle *origStyle;
  QStyleSheetStyle *proxy;
  QStyle *extraStyle;
  QWidget *q;
  QApplication *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  WidgetAttribute attribute;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar5;
  undefined1 uVar6;
  QStyleSheetStyle *in_stack_ffffffffffffff50;
  QWidgetPrivate *pQVar7;
  QStyle *local_a8;
  QStyle *local_98;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 propagate;
  QStyle *in_stack_ffffffffffffff88;
  QWidgetPrivate *this_00;
  QWidgetPrivate *this_01;
  
  propagate = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36777c);
  if (bVar2) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367790);
    local_98 = ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x36779c);
  }
  else {
    local_98 = (QStyle *)0x0;
  }
  pQVar3 = qt_styleSheet((QStyle *)0x3677c0);
  QWidget::styleSheet((QWidget *)
                      CONCAT17(in_stack_ffffffffffffff4f,
                               CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  bVar2 = QString::isEmpty((QString *)0x3677e7);
  QString::~QString((QString *)0x3677fa);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    QStyleSheetStyle::repolish
              (in_stack_ffffffffffffff50,
               (QWidget *)
               CONCAT17(in_stack_ffffffffffffff4f,
                        CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    goto LAB_00367a1a;
  }
  if (pQVar3 == (QStyleSheetStyle *)0x0) {
    local_a8 = local_98;
  }
  else {
    local_a8 = pQVar3->base;
  }
  pQVar4 = QWidget::parentWidget((QWidget *)0x367854);
  if (pQVar4 == (QWidget *)0x0) {
LAB_003678a6:
    pQVar7 = (QWidgetPrivate *)0x0;
  }
  else {
    QWidget::d_func((QWidget *)0x36786b);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367877);
    if (!bVar2) goto LAB_003678a6;
    QWidget::d_func((QWidget *)0x367887);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367893);
    pQVar7 = (QWidgetPrivate *)::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x36789f);
  }
  this_00 = pQVar7;
  QCoreApplication::instance();
  QApplication::styleSheet(in_stack_ffffffffffffff38);
  bVar2 = QString::isEmpty((QString *)0x3678db);
  bVar5 = true;
  if (bVar2) {
    pQVar3 = qt_styleSheet((QStyle *)0x3678f4);
    bVar5 = pQVar3 != (QStyleSheetStyle *)0x0;
  }
  uVar6 = bVar5;
  QString::~QString((QString *)0x367914);
  if ((bVar5 & 1) == 0) {
    if (local_a8 != local_98) {
      QWidget::testAttribute
                ((QWidget *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff48)),attribute);
      setStyle_helper(this_00,in_stack_ffffffffffffff88,(bool)propagate);
    }
  }
  else {
    this_01 = this_00;
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff48)),
                       attribute);
    if ((bVar2) && (pQVar3 = qt_styleSheet((QStyle *)0x36794d), pQVar3 == (QStyleSheetStyle *)0x0))
    {
      newStyle_00 = (QWidgetPrivate *)operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle
                ((QStyleSheetStyle *)pQVar7,
                 (QStyle *)CONCAT17(uVar6,CONCAT16(bVar5,in_stack_ffffffffffffff48)));
    }
    else {
      pQVar7 = (QWidgetPrivate *)qt_styleSheet((QStyle *)0x367985);
      newStyle_00 = pQVar7;
      if ((pQVar7 == (QWidgetPrivate *)0x0) &&
         (pQVar3 = qt_styleSheet((QStyle *)0x3679a8), newStyle_00 = this_00,
         pQVar3 != (QStyleSheetStyle *)0x0)) {
        QStyleSheetStyle::ref((QStyleSheetStyle *)pQVar3);
        newStyle_00 = this_00;
      }
      propagate = (undefined1)((ulong)pQVar7 >> 0x38);
    }
    setStyle_helper(this_01,(QStyle *)newStyle_00,(bool)propagate);
  }
LAB_00367a1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::inheritStyle()
{
#ifndef QT_NO_STYLE_STYLESHEET
    Q_Q(QWidget);

    QStyle *extraStyle = extra ? (QStyle*)extra->style : nullptr;

    QStyleSheetStyle *proxy = qt_styleSheet(extraStyle);

    if (!q->styleSheet().isEmpty()) {
        Q_ASSERT(proxy);
        proxy->repolish(q);
        return;
    }

    QStyle *origStyle = proxy ? proxy->base : extraStyle;
    QWidget *parent = q->parentWidget();
    QStyle *parentStyle = (parent && parent->d_func()->extra) ? (QStyle*)parent->d_func()->extra->style : nullptr;
    // If we have stylesheet on app or parent has stylesheet style, we need
    // to be running a proxy
    if (!qApp->styleSheet().isEmpty() || qt_styleSheet(parentStyle)) {
        QStyle *newStyle = parentStyle;
        if (q->testAttribute(Qt::WA_SetStyle) && qt_styleSheet(origStyle) == nullptr)
            newStyle = new QStyleSheetStyle(origStyle);
        else if (auto *styleSheetStyle = qt_styleSheet(origStyle))
            newStyle = styleSheetStyle;
        else if (QStyleSheetStyle *newProxy = qt_styleSheet(parentStyle))
            newProxy->ref();

        setStyle_helper(newStyle, true);
        return;
    }

    // So, we have no stylesheet on parent/app and we have an empty stylesheet
    // we just need our original style back
    if (origStyle == extraStyle) // is it any different?
        return;

    // We could have inherited the proxy from our parent (which has a custom style)
    // In such a case we need to start following the application style (i.e revert
    // the propagation behavior of QStyleSheetStyle)
    if (!q->testAttribute(Qt::WA_SetStyle))
        origStyle = nullptr;

    setStyle_helper(origStyle, true);
#endif // QT_NO_STYLE_STYLESHEET
}